

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

int mfdestroy(mFILE *mf)

{
  if (mf != (mFILE *)0x0) {
    if (mf->data != (char *)0x0) {
      free(mf->data);
    }
    free(mf);
    return 0;
  }
  return -1;
}

Assistant:

int mfdestroy(mFILE *mf) {
    if (!mf)
	return -1;

    if (mf->data)
	free(mf->data);
    free(mf);

    return 0;
}